

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

int Abc_SclFindUpsizes(SC_Man *p,Vec_Int_t *vPathNodes,int Ratio,int Notches,int iIter,int DelayGap,
                      int fMoreConserf)

{
  Abc_Ntk_t *pNtk;
  Vec_Flt_t *p_00;
  Vec_Que_t *p_01;
  SC_Lib *p_02;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Abc_Obj_t *pObj_00;
  double dVar6;
  Abc_Obj_t *pObj_1;
  int iNode;
  int iIterLast;
  int Counter;
  int Limit;
  int gateBest;
  int i;
  float dGainBest2;
  float dGainBest;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFanouts;
  Vec_Int_t *vEvals;
  Vec_Int_t *vRecalcs;
  SC_Cell *pCellNew;
  SC_Cell *pCellOld;
  int DelayGap_local;
  int iIter_local;
  int Notches_local;
  int Ratio_local;
  Vec_Int_t *vPathNodes_local;
  SC_Man *p_local;
  
  pCellOld._0_4_ = DelayGap;
  pCellOld._4_4_ = iIter;
  DelayGap_local = Notches;
  iIter_local = Ratio;
  _Notches_local = vPathNodes;
  vPathNodes_local = (Vec_Int_t *)p;
  vEvals = Vec_IntAlloc(100);
  vFanouts = (Vec_Ptr_t *)Vec_IntAlloc(100);
  Vec_QueClear(*(Vec_Que_t **)(vPathNodes_local + 0xb));
  for (Limit = 0; iVar2 = Vec_IntSize(_Notches_local), Limit < iVar2; Limit = Limit + 1) {
    pNtk = (Abc_Ntk_t *)vPathNodes_local->pArray;
    iVar2 = Vec_IntEntry(_Notches_local,Limit);
    _dGainBest2 = Abc_NtkObj(pNtk,iVar2);
    if (_dGainBest2 != (Abc_Obj_t *)0x0) {
      if ((*(uint *)&_dGainBest2->field_0x14 >> 5 & 1) != 0) {
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                      ,0x263,
                      "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
      }
      pVVar1 = (Vec_Int_t *)vPathNodes_local[0xc].pArray;
      uVar5 = Abc_ObjId(_dGainBest2);
      iVar2 = Vec_IntEntry(pVVar1,uVar5);
      if ((iVar2 < 0) || (iVar2 + 5 <= pCellOld._4_4_)) {
        Abc_SclFindNodesToUpdate(_dGainBest2,&vEvals,(Vec_Int_t **)&vFanouts,(Abc_Obj_t *)0x0);
        iVar2 = Vec_IntSize((Vec_Int_t *)vFanouts);
        if (iVar2 < 1) {
          __assert_fail("Vec_IntSize(vEvals) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                        ,0x269,
                        "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
        }
        iVar2 = Abc_SclFindBestCell((SC_Man *)vPathNodes_local,_dGainBest2,vEvals,
                                    (Vec_Int_t *)vFanouts,DelayGap_local,(int)pCellOld,(float *)&i);
        if (-1 < iVar2) {
          if ((float)i <= 0.0) {
            __assert_fail("dGainBest > 0.0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                          ,0x26f,
                          "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
          }
          p_00 = (Vec_Flt_t *)vPathNodes_local[0xb].pArray;
          uVar5 = Abc_ObjId(_dGainBest2);
          Vec_FltWriteEntry(p_00,uVar5,(float)i);
          pVVar1 = *(Vec_Int_t **)(vPathNodes_local + 0xc);
          uVar5 = Abc_ObjId(_dGainBest2);
          Vec_IntWriteEntry(pVVar1,uVar5,iVar2);
          p_01 = *(Vec_Que_t **)(vPathNodes_local + 0xb);
          uVar5 = Abc_ObjId(_dGainBest2);
          Vec_QuePush(p_01,uVar5);
        }
      }
    }
  }
  Vec_IntFree(vEvals);
  Vec_IntFree((Vec_Int_t *)vFanouts);
  iVar2 = Vec_QueSize(*(Vec_Que_t **)(vPathNodes_local + 0xb));
  if (iVar2 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar2 = Vec_QueSize(*(Vec_Que_t **)(vPathNodes_local + 0xb));
    dVar6 = (double)iIter_local;
    iVar3 = Vec_IntSize(_Notches_local);
    iVar3 = Abc_MaxInt((int)(dVar6 * 0.01 * (double)iVar3),1);
    iVar2 = Abc_MinInt(iVar2,iVar3);
    gateBest = -0x40800000;
    iNode = 0;
    pObj = (Abc_Obj_t *)Vec_PtrAlloc(100);
    do {
      do {
        iVar3 = Vec_QueSize(*(Vec_Que_t **)(vPathNodes_local + 0xb));
        if (iVar3 == 0) goto LAB_00555b0b;
        iVar3 = Vec_QuePop(*(Vec_Que_t **)(vPathNodes_local + 0xb));
        pObj_00 = Abc_NtkObj((Abc_Ntk_t *)vPathNodes_local->pArray,iVar3);
        if ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) == 0) {
          __assert_fail("pObj->fMarkA",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                        ,0x29d,
                        "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
        }
        iVar4 = Abc_SclObjCheckMarkedFanFans(pObj_00);
      } while (iVar4 != 0);
      Abc_SclObjMarkFanFans(pObj_00,(Vec_Ptr_t *)pObj);
      if (((float)gateBest == -1.0) && (!NAN((float)gateBest))) {
        gateBest = (int)Vec_FltEntry((Vec_Flt_t *)vPathNodes_local[0xb].pArray,iVar3);
      }
      pCellNew = Abc_SclObjCell(pObj_00);
      p_02 = *(SC_Lib **)vPathNodes_local;
      pVVar1 = *(Vec_Int_t **)(vPathNodes_local + 0xc);
      uVar5 = Abc_ObjId(pObj_00);
      iVar3 = Vec_IntEntry(pVVar1,uVar5);
      vRecalcs = (Vec_Int_t *)SC_LibCell(p_02,iVar3);
      if ((SC_Cell *)vRecalcs == (SC_Cell *)0x0) {
        __assert_fail("pCellNew != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                      ,0x2ab,
                      "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
      }
      *(float *)((long)&vPathNodes_local[0xe].pArray + 4) =
           (((SC_Cell *)vRecalcs)->area - pCellNew->area) +
           *(float *)((long)&vPathNodes_local[0xe].pArray + 4);
      Abc_SclObjSetCell(pObj_00,(SC_Cell *)vRecalcs);
      Abc_SclUpdateLoad((SC_Man *)vPathNodes_local,pObj_00,pCellNew,(SC_Cell *)vRecalcs);
      pVVar1 = *(Vec_Int_t **)(vPathNodes_local + 2);
      uVar5 = Abc_ObjId(pObj_00);
      Vec_IntPush(pVVar1,uVar5);
      Vec_IntPush(*(Vec_Int_t **)(vPathNodes_local + 2),*(int *)&vRecalcs->pArray);
      Abc_SclTimeIncInsert((SC_Man *)vPathNodes_local,pObj_00);
      pVVar1 = (Vec_Int_t *)vPathNodes_local[0xc].pArray;
      uVar5 = Abc_ObjId(pObj_00);
      Vec_IntWriteEntry(pVVar1,uVar5,pCellOld._4_4_);
      iNode = iNode + 1;
    } while (iNode != iVar2);
LAB_00555b0b:
    for (Limit = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pObj), Limit < iVar2; Limit = Limit + 1) {
      _dGainBest2 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,Limit);
      *(uint *)&_dGainBest2->field_0x14 = *(uint *)&_dGainBest2->field_0x14 & 0xffffffdf;
    }
    Vec_PtrFree((Vec_Ptr_t *)pObj);
    p_local._4_4_ = iNode;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_SclFindUpsizes( SC_Man * p, Vec_Int_t * vPathNodes, int Ratio, int Notches, int iIter, int DelayGap, int fMoreConserf )
{
    SC_Cell * pCellOld, * pCellNew;
    Vec_Int_t * vRecalcs, * vEvals;
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pObj;
    float dGainBest, dGainBest2;
    int i, gateBest, Limit, Counter, iIterLast;

    // compute savings due to upsizing each node
    vRecalcs = Vec_IntAlloc( 100 );
    vEvals = Vec_IntAlloc( 100 );
    Vec_QueClear( p->vNodeByGain );
    Abc_NtkForEachObjVec( vPathNodes, p->pNtk, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        iIterLast = Vec_IntEntry(p->vNodeIter, Abc_ObjId(pObj));
        if ( iIterLast >= 0 && iIterLast + 5 > iIter )
            continue;
        // compute nodes to recalculate timing and nodes to evaluate afterwards
        Abc_SclFindNodesToUpdate( pObj, &vRecalcs, &vEvals, NULL );
        assert( Vec_IntSize(vEvals) > 0 );
        //printf( "%d -> %d\n", Vec_IntSize(vRecalcs), Vec_IntSize(vEvals) );
        gateBest = Abc_SclFindBestCell( p, pObj, vRecalcs, vEvals, Notches, DelayGap, &dGainBest );
        // remember savings
        if ( gateBest >= 0 )
        {
            assert( dGainBest > 0.0 );
            Vec_FltWriteEntry( p->vNode2Gain, Abc_ObjId(pObj), dGainBest );
            Vec_IntWriteEntry( p->vNode2Gate, Abc_ObjId(pObj), gateBest );
            Vec_QuePush( p->vNodeByGain, Abc_ObjId(pObj) );
        }
    }
    Vec_IntFree( vRecalcs );
    Vec_IntFree( vEvals );
    if ( Vec_QueSize(p->vNodeByGain) == 0 )
        return 0;
/*
    Limit = Abc_MinInt( Vec_QueSize(p->vNodeByGain), Abc_MaxInt((int)(0.01 * Ratio * Vec_IntSize(vPathNodes)), 1) ); 
    //printf( "\nSelecting %d out of %d\n", Limit, Vec_QueSize(p->vNodeByGain) );
    for ( i = 0; i < Limit; i++ )
    {
        // get the object
        pObj = Abc_NtkObj( p->pNtk, Vec_QuePop(p->vNodeByGain) );
        assert( pObj->fMarkA );
        // find old and new gates
        pCellOld = Abc_SclObjCell( pObj );
        pCellNew = SC_LibCell( p->pLib, Vec_IntEntry(p->vNode2Gate, Abc_ObjId(pObj)) );
        assert( pCellNew != NULL );
        //printf( "%6d  %20s -> %20s  ", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName );
        //printf( "gain is %f\n", Vec_FltEntry(p->vNode2Gain, Abc_ObjId(pObj)) );
        // update gate
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        p->SumArea += pCellNew->area - pCellOld->area;
        Abc_SclObjSetCell( pObj, pCellNew );
        // record the update
        Vec_IntPush( p->vUpdates, Abc_ObjId(pObj) );
        Vec_IntPush( p->vUpdates, pCellNew->Id );
        Abc_SclTimeIncInsert( p, pObj );
        // remember when this node was upsized
        Vec_IntWriteEntry( p->vNodeIter, Abc_ObjId(pObj), iIter );
    }
return Limit;
*/

    Limit = Abc_MinInt( Vec_QueSize(p->vNodeByGain), Abc_MaxInt((int)(0.01 * Ratio * Vec_IntSize(vPathNodes)), 1) ); 
    dGainBest2 = -1;
    Counter = 0;
    vFanouts = Vec_PtrAlloc( 100 );
    while ( Vec_QueSize(p->vNodeByGain) )
    {
        int iNode = Vec_QuePop(p->vNodeByGain);
        Abc_Obj_t * pObj = Abc_NtkObj( p->pNtk, iNode );
        assert( pObj->fMarkA );
        if ( Abc_SclObjCheckMarkedFanFans( pObj ) )
            continue;
        Abc_SclObjMarkFanFans( pObj, vFanouts );
        // remember gain
        if ( dGainBest2 == -1 )
            dGainBest2 = Vec_FltEntry(p->vNode2Gain, iNode);
//        else if ( dGainBest2 > 3*Vec_FltEntry(p->vNode2Gain, iNode) )
//            break;
//        printf( "%.1f ", Vec_FltEntry(p->vNode2Gain, iNode) );

        // find old and new gates
        pCellOld = Abc_SclObjCell( pObj );
        pCellNew = SC_LibCell( p->pLib, Vec_IntEntry(p->vNode2Gate, Abc_ObjId(pObj)) );
        assert( pCellNew != NULL );
        //printf( "%6d  %20s -> %20s  ", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName );
        //printf( "gain is %f\n", Vec_FltEntry(p->vNode2Gain, Abc_ObjId(pObj)) );
//        if ( pCellOld->Order > 0 )
//            printf( "%.2f  %d -> %d(%d)   ", Vec_FltEntry(p->vNode2Gain, iNode), pCellOld->Order, pCellNew->Order, pCellNew->nGates );
        // update gate
        p->SumArea += pCellNew->area - pCellOld->area;
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // record the update
        Vec_IntPush( p->vUpdates, Abc_ObjId(pObj) );
        Vec_IntPush( p->vUpdates, pCellNew->Id );
        Abc_SclTimeIncInsert( p, pObj );
        // remember when this node was upsized
        Vec_IntWriteEntry( p->vNodeIter, Abc_ObjId(pObj), iIter );
        Counter++;
        if ( Counter == Limit )
            break;
    }
//    printf( "\n" );

    Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pObj, i )
        pObj->fMarkB = 0;
    Vec_PtrFree( vFanouts );
    return Counter;
}